

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * ImageCopy(Image image)

{
  int format;
  int iVar1;
  void *__dest;
  int iVar2;
  Image *in_RDI;
  int width;
  uint uVar3;
  ulong __size;
  int height;
  void *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  
  format = in_stack_0000001c;
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  __size = 0;
  width = in_stack_00000010;
  iVar2 = in_stack_00000018;
  height = in_stack_00000014;
  if (0 < in_stack_00000018) {
    do {
      iVar1 = GetPixelDataSize(width,height,format);
      uVar3 = (int)__size + iVar1;
      __size = (ulong)uVar3;
      width = width / 2;
      height = height / 2;
      if (width < 2) {
        width = 1;
      }
      if (height < 2) {
        height = 1;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    __size = (ulong)(int)uVar3;
  }
  __dest = malloc(__size);
  in_RDI->data = __dest;
  if (__dest != (void *)0x0) {
    memcpy(__dest,in_stack_00000008,__size);
    in_RDI->width = in_stack_00000010;
    in_RDI->height = in_stack_00000014;
    in_RDI->mipmaps = in_stack_00000018;
    in_RDI->format = in_stack_0000001c;
  }
  return in_RDI;
}

Assistant:

Image ImageCopy(Image image)
{
    Image newImage = { 0 };

    int width = image.width;
    int height = image.height;
    int size = 0;

    for (int i = 0; i < image.mipmaps; i++)
    {
        size += GetPixelDataSize(width, height, image.format);

        width /= 2;
        height /= 2;

        // Security check for NPOT textures
        if (width < 1) width = 1;
        if (height < 1) height = 1;
    }

    newImage.data = RL_MALLOC(size);

    if (newImage.data != NULL)
    {
        // NOTE: Size must be provided in bytes
        memcpy(newImage.data, image.data, size);

        newImage.width = image.width;
        newImage.height = image.height;
        newImage.mipmaps = image.mipmaps;
        newImage.format = image.format;
    }

    return newImage;
}